

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_filter(HSQUIRRELVM v)

{
  SQArray *x;
  SQRESULT SVar1;
  SQObjectPtr *o_00;
  SQObjectPtr *in_RDI;
  SQInteger n;
  SQObjectPtr val;
  SQInteger size;
  SQObjectPtr ret;
  SQArray *a;
  SQObject *o;
  SQObjectPtr *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  SQObjectPtr *in_stack_ffffffffffffff68;
  SQObjectPtr *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  SQArray *in_stack_ffffffffffffff80;
  SQObjectValue in_stack_ffffffffffffff88;
  SQInteger in_stack_ffffffffffffff90;
  SQObjectValue in_stack_ffffffffffffff98;
  SQInteger local_60;
  SQObjectPtr local_48;
  SQInteger local_38;
  SQObjectPtr local_30;
  SQObjectValue local_20;
  SQObject *local_18;
  SQObjectPtr *local_10;
  SQInteger local_8;
  
  local_10 = in_RDI;
  local_18 = &stack_get((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        (SQInteger)in_stack_ffffffffffffff48)->super_SQObject;
  local_20 = local_18->_unVal;
  x = SQArray::Create((SQSharedState *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                      ,(SQInteger)in_stack_ffffffffffffff48);
  SQObjectPtr::SQObjectPtr(&local_30,x);
  local_38 = SQArray::Size((SQArray *)0x11eb22);
  SQObjectPtr::SQObjectPtr(&local_48);
  local_60 = 0;
  do {
    if (local_38 <= local_60) {
      SQVM::Push((SQVM *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      local_8 = 1;
LAB_0011ed34:
      SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      return local_8;
    }
    SQArray::Get((SQArray *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (SQInteger)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff70 = local_10;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff90,local_18);
    SQVM::Push((SQVM *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    in_stack_ffffffffffffff68 = local_10;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff80,local_60);
    SQVM::Push((SQVM *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    SQVM::Push((SQVM *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    SVar1 = sq_call((HSQUIRRELVM)in_stack_ffffffffffffff98.pTable,in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88.nInteger,(SQBool)in_stack_ffffffffffffff80);
    if (SVar1 < 0) {
      local_8 = -1;
      goto LAB_0011ed34;
    }
    o_00 = SQVM::GetUp((SQVM *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (SQInteger)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff57 = SQVM::IsFalse(o_00);
    if (!(bool)in_stack_ffffffffffffff57) {
      SQArray::Append(in_stack_ffffffffffffff80,
                      (SQObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    SQVM::Pop((SQVM *)0x11ecf2);
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

static SQInteger array_filter(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQObjectPtr ret = SQArray::Create(_ss(v),0);
    SQInteger size = a->Size();
    SQObjectPtr val;
    for(SQInteger n = 0; n < size; n++) {
        a->Get(n,val);
        v->Push(o);
        v->Push(n);
        v->Push(val);
        if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
            return SQ_ERROR;
        }
        if(!SQVM::IsFalse(v->GetUp(-1))) {
            _array(ret)->Append(val);
        }
        v->Pop();
    }
    v->Push(ret);
    return 1;
}